

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

float trng::math::detail::Beta<float>(float x,float y)

{
  int iVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (Beta<float>(float,float)::ln_max == '\0') {
    iVar1 = __cxa_guard_acquire(&Beta<float>(float,float)::ln_max);
    if (iVar1 != 0) {
      Beta<float>::ln_max = 88.72284;
      __cxa_guard_release(&Beta<float>(float,float)::ln_max);
    }
  }
  if ((x <= 0.0) || (y <= 0.0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    fVar3 = NAN;
  }
  else {
    fVar3 = x + y;
    fVar4 = logf(fVar3);
    if (Beta<float>::ln_max < fVar4 * fVar3 - fVar3) {
      fVar4 = lgammaf(x);
      fVar5 = lgammaf(y);
      fVar3 = lgammaf(fVar3);
      fVar3 = expf((fVar5 + fVar4) - fVar3);
      return fVar3;
    }
    fVar4 = tgammaf(x);
    fVar5 = tgammaf(fVar3);
    fVar3 = tgammaf(y);
    fVar3 = fVar3 * (fVar4 / fVar5);
  }
  return fVar3;
}

Assistant:

TRNG_CUDA_ENABLE T Beta(T x, T y) {
        static const T ln_max{ln(numeric_limits<T>::max())};
        if (x <= 0 or y <= 0) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::signaling_NaN();
        }
        const T z{x + y};
        if (z * ln(z) - z > ln_max)
          // less accurate but avoids overflow
          return exp(ln_Gamma(x) + ln_Gamma(y) - ln_Gamma(z));
        return Gamma(x) / Gamma(z) * Gamma(y);
      }